

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O0

void __thiscall Preprocessor::substituteUntilNewline(Preprocessor *this,Symbols *substituted)

{
  bool bVar1;
  bool bVar2;
  Token TVar3;
  Preprocessor *that;
  Symbol *pSVar4;
  Symbols *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  bool braces;
  Token token;
  Symbol definedOrNotDefined;
  Symbol *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  Token in_stack_ffffffffffffff54;
  Parser *in_stack_ffffffffffffff58;
  Symbols *toExpand;
  undefined4 in_stack_ffffffffffffff70;
  int iVar5;
  undefined1 local_40 [4];
  undefined4 local_3c;
  Data *local_8;
  
  local_8 = *(Data **)(in_FS_OFFSET + 0x28);
LAB_00168de0:
  do {
    bVar1 = Parser::hasNext((Parser *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50))
    ;
    if (!bVar1) {
LAB_00168f9d:
      if (*(Data **)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return;
    }
    TVar3 = Parser::next(in_stack_ffffffffffffff58);
    if (TVar3 != IDENTIFIER) {
      if (TVar3 == PP_DEFINED) {
        bVar1 = Parser::test(in_stack_ffffffffffffff58,in_stack_ffffffffffffff54);
        Parser::next((Parser *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     (Token)((ulong)in_stack_ffffffffffffff48 >> 0x20));
        memset(local_40,0xaa,0x30);
        Parser::symbol((Parser *)0x168ecb);
        Symbol::Symbol((Symbol *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                       in_stack_ffffffffffffff48);
        in_stack_ffffffffffffff58 = (Parser *)(in_RDI + 0x80);
        Symbol::operator_cast_to_SubArray(in_stack_ffffffffffffff48);
        bVar2 = QHash<SubArray,_Macro>::contains
                          ((QHash<SubArray,_Macro> *)in_stack_ffffffffffffff58,
                           (SubArray *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50)
                          );
        local_3c = 0xb6;
        if (bVar2) {
          local_3c = 0xb5;
        }
        SubArray::~SubArray((SubArray *)0x168f26);
        QList<Symbol>::operator+=
                  ((QList<Symbol> *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                   in_stack_ffffffffffffff48);
        if (bVar1) {
          Parser::test(in_stack_ffffffffffffff58,in_stack_ffffffffffffff54);
        }
        Symbol::~Symbol((Symbol *)0x168f55);
      }
      else {
        if (TVar3 == NEWLINE) {
          Parser::symbol((Parser *)0x168f6e);
          QList<Symbol>::operator+=
                    ((QList<Symbol> *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     in_stack_ffffffffffffff48);
          goto LAB_00168f9d;
        }
        Parser::symbol((Parser *)0x168f87);
        QList<Symbol>::operator+=
                  ((QList<Symbol> *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                   in_stack_ffffffffffffff48);
      }
      goto LAB_00168de0;
    }
    that = (Preprocessor *)(in_RDI + 0x18);
    toExpand = in_RSI;
    pSVar4 = Parser::symbol((Parser *)0x168e28);
    iVar5 = pSVar4->lineNum;
    QSet<QByteArray>::QSet((QSet<QByteArray> *)0x168e3b);
    in_stack_ffffffffffffff48 = (Symbol *)&stack0xfffffffffffffff0;
    macroExpand((Symbols *)CONCAT44(iVar5,in_stack_ffffffffffffff70),that,toExpand,
                (qsizetype *)in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                SUB41((uint)in_stack_ffffffffffffff50 >> 0x18,0),
                (QSet<QByteArray> *)definedOrNotDefined.lex.d.d);
    QSet<QByteArray>::~QSet((QSet<QByteArray> *)0x168e76);
  } while( true );
}

Assistant:

void Preprocessor::substituteUntilNewline(Symbols &substituted)
{
    while (hasNext()) {
        Token token = next();
        if (token == PP_IDENTIFIER) {
            macroExpand(&substituted, this, symbols, index, symbol().lineNum, true);
        } else if (token == PP_DEFINED) {
            bool braces = test(PP_LPAREN);
            next(PP_IDENTIFIER);
            Symbol definedOrNotDefined = symbol();
            definedOrNotDefined.token = macros.contains(definedOrNotDefined)? PP_MOC_TRUE : PP_MOC_FALSE;
            substituted += definedOrNotDefined;
            if (braces)
                test(PP_RPAREN);
            continue;
        } else if (token == PP_NEWLINE) {
            substituted += symbol();
            break;
        } else {
            substituted += symbol();
        }
    }
}